

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::FiberPool::Impl::disposeImpl(Impl *this,void *pointer)

{
  value_type pFVar1;
  size_type sVar2;
  long lVar3;
  FiberStack *stack;
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>
  _kjDefer663;
  value_type local_30;
  undefined1 local_28 [16];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>
  local_18;
  
  local_18.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
        )&local_30;
  local_18.maybeFunc.ptr.isSet = true;
  local_30 = (value_type)pointer;
  if (*(int *)((long)pointer + 8) == 0) {
    lookupCoreLocalFreelist((Impl *)local_28);
    if ((_func_int **)local_28._0_8_ == (_func_int **)0x0) {
LAB_0036280e:
      MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
      lockExclusive((MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                     *)local_28,&this->freelist);
      std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::push_back
                ((deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)local_28._8_8_,
                 &local_30);
      sVar2 = std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::size
                        ((deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)
                         local_28._8_8_);
      if (this->maxFreelist < sVar2) {
        local_30 = *((iterator *)(local_28._8_8_ + 0x10))->_M_cur;
        std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::pop_front
                  ((deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *)
                   local_28._8_8_);
      }
      else {
        local_30 = (FiberStack *)0x0;
      }
      Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::~Locked
                ((Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *)
                 local_28);
    }
    else {
      lVar3 = 0;
      do {
        if (lVar3 == 0x10) goto LAB_0036280e;
        LOCK();
        pFVar1 = *(value_type *)(local_28._0_8_ + lVar3);
        *(value_type *)(local_28._0_8_ + lVar3) = local_30;
        UNLOCK();
        lVar3 = lVar3 + 8;
        local_30 = pFVar1;
      } while (pFVar1 != (value_type)0x0);
      local_30 = (FiberStack *)0x0;
    }
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:663:5)>
  ::run(&local_18);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    _::FiberStack* stack = reinterpret_cast<_::FiberStack*>(pointer);
    KJ_DEFER(delete stack);

    // Verify that the stack was reset before returning, otherwise it might be in a weird state
    // where we don't want to reuse it.
    if (stack->isReset()) {
#if USE_CORE_LOCAL_FREELISTS
      KJ_IF_SOME(core, lookupCoreLocalFreelist()) {
        for (auto& stackPtr: core.stacks) {
          stack = __atomic_exchange_n(&stackPtr, stack, __ATOMIC_RELEASE);
          if (stack == nullptr) {
            // Cool, we inserted the stack into an unused slot. We're done.
            return;
          }
        }
        // All slots were occupied, so we inserted the new stack in the front, pushed the rest back,
        // and now `stack` refers to the stack that fell off the end of the core-local list. That
        // needs to go into the global freelist.
      }
#endif

      auto lock = freelist.lockExclusive();
      lock->push_back(stack);
      if (lock->size() > maxFreelist) {
        stack = lock->front();
        lock->pop_front();
      } else {
        stack = nullptr;
      }
    }
  }